

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

WirehairResult __thiscall
wirehair::Codec::InitializeDecoder(Codec *this,uint64_t message_bytes,uint32_t block_bytes)

{
  uint uVar1;
  bool bVar2;
  WirehairResult WVar3;
  uint uVar4;
  
  WVar3 = ChooseMatrix(this,message_bytes,block_bytes);
  if (WVar3 == Wirehair_Success) {
    uVar1 = this->_block_bytes;
    uVar4 = (uint)(message_bytes % (ulong)uVar1);
    if (message_bytes % (ulong)uVar1 == 0) {
      uVar4 = uVar1;
    }
    this->_output_final_bytes = uVar4;
    this->_input_final_bytes = uVar1;
    this->_extra_count = 0x20;
    this->_row_count = 0;
    this->_all_original = true;
    this->_original_out_of_order = true;
    bVar2 = AllocateInput(this);
    WVar3 = Wirehair_OOM;
    if (bVar2) {
      bVar2 = AllocateWorkspace(this);
      WVar3 = (uint)!bVar2 + (uint)!bVar2 * 8;
    }
  }
  return WVar3;
}

Assistant:

WirehairResult Codec::InitializeDecoder(
    uint64_t message_bytes,
    uint32_t block_bytes)
{
    const WirehairResult result = ChooseMatrix(message_bytes, block_bytes);

    if (result != Wirehair_Success) {
        return result;
    }

    // Calculate partial final bytes
    unsigned partial_final_bytes = message_bytes % _block_bytes;
    if (partial_final_bytes <= 0) {
        partial_final_bytes = _block_bytes;
    }

    // Decoder-specific
    _row_count = 0;
    _output_final_bytes = partial_final_bytes;

    // Hack: Prevents row-based ids from causing partial copies when they
    // happen to be the last block id.  This is only an issue because the
    // shared codec source code happens to be built with more encoder-like
    // semantics
    _input_final_bytes = _block_bytes;

    _extra_count = CAT_MAX_EXTRA_ROWS;
#if defined(CAT_ALL_ORIGINAL)
    _all_original = true;
#endif
    _original_out_of_order = true;

    if (!AllocateInput()) {
        CAT_DEBUG_BREAK();
        return Wirehair_OOM;
    }

    if (!AllocateWorkspace()) {
        CAT_DEBUG_BREAK();
        return Wirehair_OOM;
    }

    return result;
}